

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

_Bool netaddr_binary_is_in_subnet(netaddr *subnet,void *bin,size_t len,uint8_t af_family)

{
  byte bVar1;
  _Bool _Var2;
  uint8_t af_family_local;
  size_t len_local;
  void *bin_local;
  netaddr *subnet_local;
  
  if ((subnet->_type == af_family) &&
     (bVar1 = netaddr_get_af_maxprefix((uint)subnet->_type), (ulong)bVar1 == len << 3)) {
    _Var2 = _binary_is_in_subnet(subnet,bin);
    return _Var2;
  }
  return false;
}

Assistant:

bool
netaddr_binary_is_in_subnet(const struct netaddr *subnet, const void *bin, size_t len, uint8_t af_family) {
  if (subnet->_type != af_family || netaddr_get_maxprefix(subnet) != len * 8) {
    return false;
  }
  return _binary_is_in_subnet(subnet, bin);
}